

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void TableSettingsHandler_ClearAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  ImGuiTable *pIVar1;
  char *ptr;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  uVar2 = (ctx->Tables).Map.Data.Size;
  if (uVar2 != 0) {
    lVar3 = 8;
    uVar4 = 0;
    do {
      pIVar1 = (ctx->Tables).Buf.Data;
      lVar5 = (long)*(int *)((long)&((ctx->Tables).Map.Data.Data)->key + lVar3);
      if (pIVar1 != (ImGuiTable *)0x0 && lVar5 != -1) {
        pIVar1[lVar5].SettingsOffset = -1;
        uVar2 = (ctx->Tables).Map.Data.Size;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar4 != uVar2);
  }
  ptr = (ctx->SettingsTables).Buf.Data;
  if (ptr != (char *)0x0) {
    (ctx->SettingsTables).Buf.Size = 0;
    (ctx->SettingsTables).Buf.Capacity = 0;
    ImGui::MemFree(ptr);
    (ctx->SettingsTables).Buf.Data = (char *)0x0;
  }
  return;
}

Assistant:

static void TableSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Tables.GetMapSize(); i++)
        if (ImGuiTable* table = g.Tables.TryGetMapData(i))
            table->SettingsOffset = -1;
    g.SettingsTables.clear();
}